

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution::ResourceAttribution
          (ResourceAttribution *this,PipelineResourceSignatureImplType *_pSignature,
          Uint32 _SignatureIndex,Uint32 _ResourceIndex,Uint32 _ImmutableSamplerIndex)

{
  PipelineResourceSignatureDesc *pPVar1;
  Char *pCVar2;
  ResourceAttribution *Args_1;
  undefined1 local_68 [8];
  string msg_1;
  string msg;
  Uint32 _ImmutableSamplerIndex_local;
  Uint32 _ResourceIndex_local;
  Uint32 _SignatureIndex_local;
  PipelineResourceSignatureImplType *_pSignature_local;
  ResourceAttribution *this_local;
  
  this->pSignature = _pSignature;
  this->SignatureIndex = _SignatureIndex;
  this->ResourceIndex = _ResourceIndex;
  this->ImmutableSamplerIndex = _ImmutableSamplerIndex;
  Args_1 = (ResourceAttribution *)(ulong)_ImmutableSamplerIndex;
  if (this->pSignature != (PipelineResourceSignatureImplType *)0x0) {
    pPVar1 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)this->pSignature);
    Args_1 = this;
    if ((uint)pPVar1->BindingIndex != this->SignatureIndex) {
      FormatString<char[26],char[78]>
                ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "pSignature == nullptr || pSignature->GetDesc().BindingIndex == SignatureIndex",
                 (char (*) [78])this);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (ResourceAttribution *)0x444;
      DebugAssertionFailed
                (pCVar2,"ResourceAttribution",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x444);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
  }
  if ((this->ResourceIndex != 0xffffffff) && (this->ImmutableSamplerIndex != 0xffffffff)) {
    FormatString<char[26],char[90]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "(ResourceIndex == InvalidResourceIndex) || (ImmutableSamplerIndex == InvalidSamplerIndex)"
               ,(char (*) [90])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x445);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

ResourceAttribution(const PipelineResourceSignatureImplType* _pSignature,
                            Uint32                                   _SignatureIndex,
                            Uint32                                   _ResourceIndex,
                            Uint32                                   _ImmutableSamplerIndex = InvalidResourceIndex) noexcept :
            pSignature{_pSignature},
            SignatureIndex{_SignatureIndex},
            ResourceIndex{_ResourceIndex},
            ImmutableSamplerIndex{_ImmutableSamplerIndex}
        {
            VERIFY_EXPR(pSignature == nullptr || pSignature->GetDesc().BindingIndex == SignatureIndex);
            VERIFY_EXPR((ResourceIndex == InvalidResourceIndex) || (ImmutableSamplerIndex == InvalidSamplerIndex));
        }